

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

bool __thiscall glcts::anon_unknown_0::DefOccurence::occurs(DefOccurence *this,GLenum shader)

{
  bool bVar1;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    return true;
  case 1:
    return shader == 0x8b31;
  case 2:
    return shader == 0x91b9 || shader == 0x8b30;
  case 3:
    bVar1 = shader == 0x8b30;
    break;
  case 4:
    bVar1 = shader == 0x8b31;
    break;
  case 5:
    return false;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                  ,0x88,"bool glcts::(anonymous namespace)::DefOccurence::occurs(GLenum) const");
  }
  return !bVar1;
}

Assistant:

bool occurs(GLenum shader) const
	{
		if (occurence == NONE_SH)
		{
			return false;
		}
		if (occurence == ALL_SH)
		{
			return true;
		}
		if (occurence == FSH_OR_CSH)
		{
			return shader == GL_FRAGMENT_SHADER || shader == GL_COMPUTE_SHADER;
		}
		if (occurence == VSH)
		{
			return shader == GL_VERTEX_SHADER;
		}
		if (occurence == ALL_BUT_FSH)
		{
			return shader != GL_FRAGMENT_SHADER;
		}
		if (occurence == ALL_BUT_VSH)
		{
			return shader != GL_VERTEX_SHADER;
		}
		assert(0);
		return false;
	}